

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

void __thiscall implementations::scheme::cell::cell(cell *this,cell *copy)

{
  cell *copy_local;
  cell *this_local;
  
  this->type = copy->type;
  std::__cxx11::string::string((string *)&this->val,(string *)&copy->val);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::vector
            (&this->list,&copy->list);
  this->proc = copy->proc;
  std::shared_ptr<implementations::scheme::environment>::shared_ptr(&this->env,&copy->env);
  return;
}

Assistant:

cell(const cell &copy) : type(copy.type), val(copy.val), list(copy.list), proc(copy.proc), env(copy.env) {}